

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stdcpp.hpp
# Opt level: O0

unique_ptr<so_5::disp::reuse::binder_for_public_disp_template_t<so_5::disp::active_group::impl::proxy_dispatcher_t,_so_5::disp::active_group::impl::binding_actions_t>,_std::default_delete<so_5::disp::reuse::binder_for_public_disp_template_t<so_5::disp::active_group::impl::proxy_dispatcher_t,_so_5::disp::active_group::impl::binding_actions_t>_>_>
 __thiscall
so_5::stdcpp::
make_unique<so_5::disp::reuse::binder_for_public_disp_template_t<so_5::disp::active_group::impl::proxy_dispatcher_t,so_5::disp::active_group::impl::binding_actions_t>,std::__cxx11::string_const&,std::__cxx11::string_const&>
          (stdcpp *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1)

{
  pointer __p;
  string local_40 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_local_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_local;
  
  local_20 = args_1;
  args_local_1 = args;
  args_local = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this;
  __p = (pointer)operator_new(0x48);
  std::__cxx11::string::string(local_40,(string *)args_local_1);
  so_5::disp::reuse::
  binder_for_public_disp_template_t<so_5::disp::active_group::impl::proxy_dispatcher_t,so_5::disp::active_group::impl::binding_actions_t>
  ::binder_for_public_disp_template_t<std::__cxx11::string_const&>
            ((binder_for_public_disp_template_t<so_5::disp::active_group::impl::proxy_dispatcher_t,so_5::disp::active_group::impl::binding_actions_t>
              *)__p,(string *)local_40,local_20);
  std::
  unique_ptr<so_5::disp::reuse::binder_for_public_disp_template_t<so_5::disp::active_group::impl::proxy_dispatcher_t,so_5::disp::active_group::impl::binding_actions_t>,std::default_delete<so_5::disp::reuse::binder_for_public_disp_template_t<so_5::disp::active_group::impl::proxy_dispatcher_t,so_5::disp::active_group::impl::binding_actions_t>>>
  ::
  unique_ptr<std::default_delete<so_5::disp::reuse::binder_for_public_disp_template_t<so_5::disp::active_group::impl::proxy_dispatcher_t,so_5::disp::active_group::impl::binding_actions_t>>,void>
            ((unique_ptr<so_5::disp::reuse::binder_for_public_disp_template_t<so_5::disp::active_group::impl::proxy_dispatcher_t,so_5::disp::active_group::impl::binding_actions_t>,std::default_delete<so_5::disp::reuse::binder_for_public_disp_template_t<so_5::disp::active_group::impl::proxy_dispatcher_t,so_5::disp::active_group::impl::binding_actions_t>>>
              *)this,__p);
  std::__cxx11::string::~string(local_40);
  return (__uniq_ptr_data<so_5::disp::reuse::binder_for_public_disp_template_t<so_5::disp::active_group::impl::proxy_dispatcher_t,_so_5::disp::active_group::impl::binding_actions_t>,_std::default_delete<so_5::disp::reuse::binder_for_public_disp_template_t<so_5::disp::active_group::impl::proxy_dispatcher_t,_so_5::disp::active_group::impl::binding_actions_t>_>,_true,_true>
          )(__uniq_ptr_data<so_5::disp::reuse::binder_for_public_disp_template_t<so_5::disp::active_group::impl::proxy_dispatcher_t,_so_5::disp::active_group::impl::binding_actions_t>,_std::default_delete<so_5::disp::reuse::binder_for_public_disp_template_t<so_5::disp::active_group::impl::proxy_dispatcher_t,_so_5::disp::active_group::impl::binding_actions_t>_>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr< T >
make_unique( ARGS && ...args )
	{
		return std::unique_ptr< T >( new T( std::forward<ARGS>(args)... ) );
	}